

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::DefaultCaseItemSyntax::getChild(DefaultCaseItemSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  long in_RDX;
  ConstTokenOrSyntax *in_RSI;
  Info *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffa8;
  Info *pIVar1;
  
  if (in_RDX == 0) {
    token.info = in_RDI;
    token._0_8_ = in_stack_ffffffffffffffa8;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x389608,token);
  }
  else if (in_RDX == 1) {
    token_00.info = in_RDI;
    token_00._0_8_ = in_stack_ffffffffffffffa8;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x389635,token_00);
  }
  else if (in_RDX == 2) {
    pIVar1 = in_RDI;
    not_null<slang::syntax::SyntaxNode_*>::get
              ((not_null<slang::syntax::SyntaxNode_*> *)
               ((long)&in_RSI[2].
                       super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                       super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                       .
                       super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                       .
                       super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                       .
                       super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                       .
                       super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                       .
                       super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
               + 8));
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)in_RDI,in_stack_ffffffffffffffa8);
    in_RDI = pIVar1;
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RSI,in_RDI);
  }
  return (ConstTokenOrSyntax *)in_RDI;
}

Assistant:

ConstTokenOrSyntax DefaultCaseItemSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return defaultKeyword;
        case 1: return colon;
        case 2: return clause.get();
        default: return nullptr;
    }
}